

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

uint Engine::getRestartLimit(uint i)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  byte bVar3;
  uint in_EDI;
  double dVar4;
  uint exp;
  char *local_28;
  uint local_8;
  uint local_4;
  
  __stream = _stderr;
  local_4 = so.restart_scale;
  switch(so.restart_type) {
  case NONE:
    if (1 < in_EDI) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/engine.cpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        local_28 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/engine.cpp"
        ;
      }
      else {
        local_28 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/engine.cpp"
                           ,0x2f);
        local_28 = local_28 + 1;
      }
      fprintf(__stream,"%s:%d: ",local_28,0x218);
      fprintf(_stderr,"A restart occurred while using search without restarts");
      abort();
    }
    local_4 = 0xffffffff;
    break;
  case CONSTANT:
    break;
  case LINEAR:
    local_4 = in_EDI * so.restart_scale;
    break;
  case LUBY:
    local_8 = in_EDI;
    while( true ) {
      bVar3 = 0;
      if (local_8 != 1) {
        do {
          bVar3 = bVar3 + 1;
        } while (1 < local_8 >> (bVar3 & 0x1f));
      }
      if (local_8 == (1 << (bVar3 + 1 & 0x1f)) - 1U) break;
      local_8 = (local_8 - (1 << (bVar3 & 0x1f))) + 1;
    }
    local_4 = (int)(1L << (bVar3 & 0x3f)) * so.restart_scale;
    break;
  case GEOMETRIC:
    dVar4 = pow(so.restart_base,(double)in_EDI);
    local_4 = local_4 * (int)dVar4;
    break;
  default:
    uVar1 = in_EDI + 1 >> 1;
    local_4 = ((uVar1 - 1 & (uVar1 ^ 0xffffffff)) + 1) * so.restart_scale;
  }
  return local_4;
}

Assistant:

unsigned int Engine::getRestartLimit(unsigned int i) {
	switch (so.restart_type) {
		case NONE:
			if (i > 1) {
				CHUFFED_ERROR("A restart occurred while using search without restarts");
			}
			return UINT_MAX;
		case CONSTANT:
			return so.restart_scale;
		case LINEAR:
			return i * so.restart_scale;
		case LUBY:
			while (true) {
				unsigned int exp = 0U;
				if (i != 1U) {
					while ((i >> (++exp)) > 1U) {
					}
				}
				if (i == (1U << (exp + 1)) - 1) {
					return static_cast<int>(1UL << exp) * so.restart_scale;
				}
				i = i - (1U << exp) + 1;
			}
		case GEOMETRIC:
			return so.restart_scale * ((int)pow(so.restart_base, i));
		default:
			i = (i + 1) / 2;
			return (((i - 1) & ~i) + 1) * so.restart_scale;
	}
	NEVER;
}